

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  double dVar1;
  long lVar2;
  long lVar3;
  MeasurementPackage *pMVar4;
  Scalar *pSVar5;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar6;
  ostream *poVar7;
  Scalar *pSVar8;
  float fVar9;
  double dVar10;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  MeasurementPackage local_68;
  MeasurementPackage local_48;
  
  lVar2 = meas_package->timestamp_;
  if (this->is_initialized_ == false) {
    this->time_us_ = lVar2;
    if (meas_package->sensor_type_ == LASER) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,0);
      local_a8.m_row = 0;
      local_a8.m_col = 1;
      local_a8.m_currentBlockRows = 1;
      *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           *pSVar5;
      local_a8.m_xpr = &this->x_;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,1);
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_a8,pSVar5);
      local_78 = 0.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar6,&local_78);
      local_80 = 0.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar6,&local_80);
      local_88 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar6,&local_88);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_a8)
      ;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&this->P_,
                          0,0);
      *pSVar8 = 0.5;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&this->P_,
                          1,1);
      *pSVar8 = 0.5;
    }
    else if (meas_package->sensor_type_ == RADAR) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,0);
      dVar10 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,1);
      dVar1 = *pSVar5;
      fVar9 = cosf((float)dVar1);
      local_a8.m_row = 0;
      local_a8.m_col = 1;
      local_a8.m_currentBlockRows = 1;
      *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double)(fVar9 * (float)dVar10);
      local_a8.m_xpr = &this->x_;
      fVar9 = sinf((float)dVar1);
      local_78 = (Scalar)(fVar9 * (float)dVar10);
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_a8,&local_78);
      local_80 = 0.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar6,&local_80);
      local_88 = 0.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar6,&local_88);
      local_70 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar6,&local_70);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_a8)
      ;
    }
    this->is_initialized_ = true;
    return;
  }
  pMVar4 = &local_68;
  lVar3 = this->time_us_;
  this->time_us_ = lVar2;
  for (dVar10 = (double)(lVar2 - lVar3) / 1000000.0; 0.1 < dVar10; dVar10 = dVar10 + -0.05) {
    Prediction(this,0.05);
  }
  Prediction(this,dVar10);
  if (meas_package->sensor_type_ == LASER) {
    MeasurementPackage::MeasurementPackage(&local_68,meas_package);
    UpdateLidar(this,&local_68);
  }
  else {
    if (meas_package->sensor_type_ != RADAR) goto LAB_00102b9c;
    MeasurementPackage::MeasurementPackage(&local_48,meas_package);
    UpdateRadar(this,&local_48);
    pMVar4 = &local_48;
  }
  free((pMVar4->raw_measurements_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
LAB_00102b9c:
  poVar7 = std::operator<<((ostream *)&std::cout,"x_ = ");
  poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_)
  ;
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"P_ = ");
  poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &this->P_);
  std::endl<char,std::char_traits<char>>(poVar7);
  return;
}

Assistant:

void UKF::ProcessMeasurement(MeasurementPackage meas_package) {
  /**
  TODO:

  Complete this function! Make sure you switch between lidar and radar
  measurements.
  */

  if (!is_initialized_){
    time_us_ = meas_package.timestamp_;
    if (meas_package.sensor_type_ == MeasurementPackage::RADAR){
      float rho = meas_package.raw_measurements_[0];
      float phi = meas_package.raw_measurements_[1];
      x_ << rho*cos(phi), rho*sin(phi), 0, 0, 0;
    }
    else if (meas_package.sensor_type_ == MeasurementPackage::LASER){
      x_ << meas_package.raw_measurements_[0],
            meas_package.raw_measurements_[1],
            0, 0, 0;
      // use smaller variance for lidar
      P_(0,0) = 0.5;
      P_(1,1) = 0.5;
    }
    is_initialized_ = true;
    return;
  }

  //compute the time elapsed between the current and previous measurements
  double dt = (double)(meas_package.timestamp_ - time_us_) / 1000000.0;	//dt - expressed in seconds
  time_us_ = meas_package.timestamp_;

  // predict state vector

  // for large time intervals (dataset-2), Eulers approx for integration fails
  // one solution is to use smaller time intervals
  while(dt > 0.1){
    const double dt_eps = 0.05;
    Prediction(dt_eps);
    dt -= dt_eps;
  }
  Prediction(dt);

  // update state vector
  if (meas_package.sensor_type_ == MeasurementPackage::RADAR){
    UpdateRadar(meas_package);
  }
  else if (meas_package.sensor_type_ == MeasurementPackage::LASER){
    UpdateLidar(meas_package);
  }

  // print the output
  cout << "x_ = " << x_ << endl;
  cout << "P_ = " << P_ << endl;
}